

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocusIntersect.cpp
# Opt level: O3

int GeoCalcs::LocusIntersect(Locus *loc1,Locus *loc2,LLPoint *intersect,double dTol,double dEps)

{
  Locus *loc;
  bool bVar1;
  uint uVar2;
  LLPoint LVar3;
  double distbase;
  double dDistFromP;
  InverseResult result;
  double dCrsFromPt;
  LLPoint pint2;
  LLPoint p1;
  PtIsOnGeodesicResult ptResult;
  double local_150;
  double local_148;
  LLPoint local_140;
  double local_130;
  LLPoint local_128;
  Locus *local_110;
  Locus *local_108;
  double local_100;
  double local_f8;
  undefined8 uStack_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  LLPoint local_c8;
  InverseResult local_b8;
  LLPoint *local_a0;
  double local_98;
  double local_90;
  LLPoint local_88;
  LLPoint local_78;
  PtIsOnGeodesicResult local_68;
  
  local_b8.azimuth = 0.0;
  local_b8.reverseAzimuth = 0.0;
  local_b8.distance = 0.0;
  local_100 = dEps;
  DistVincenty(&loc1->locusStart,&loc1->locusEnd,&local_b8);
  local_f8 = local_b8.azimuth;
  DistVincenty(&loc2->locusStart,&loc2->locusEnd,&local_b8);
  local_78.latitude = 0.0;
  local_78.longitude = 0.0;
  bVar1 = CrsIntersect(&loc1->locusStart,local_f8,&loc2->locusStart,local_b8.azimuth,dTol,&local_78)
  ;
  if (bVar1) {
    DistVincenty(&loc1->geoStart,&loc1->geoEnd,&local_b8);
    local_148 = local_b8.azimuth;
    DistVincenty(&loc2->geoStart,&loc2->geoEnd,&local_b8);
    local_98 = local_b8.azimuth;
    LVar3 = PerpIntercept(&loc1->geoStart,local_148,&local_78,&local_90,&local_130,dTol);
    local_140.longitude = LVar3.longitude;
    local_140.latitude = LVar3.latitude;
    local_68.geoPt.latitude = 0.0;
    local_68.geoPt.longitude = 0.0;
    local_68.geoEnd.latitude = 0.0;
    local_68.geoEnd.longitude = 0.0;
    local_68.geoStart.latitude = 0.0;
    local_68.geoStart.longitude = 0.0;
    local_68.lengthCode = 0;
    local_68.result = 0;
    bVar1 = PtIsOnGeodesic(&loc1->geoStart,&loc1->geoEnd,&local_140,0,&local_68);
    if ((bVar1) && (local_68.result != 0)) {
      local_108 = loc2;
      local_a0 = intersect;
      DistVincenty(&loc1->geoStart,&local_140,&local_b8);
      local_150 = local_b8.distance;
      local_128.latitude = 0.0;
      local_128.longitude = 0.0;
      local_c8.latitude = 0.0;
      local_c8.longitude = 0.0;
      local_e8 = 0.0;
      dStack_e0 = 0.0;
      local_d8 = 0.0;
      dStack_d0 = 0.0;
      local_f8 = 0.0;
      uStack_f0 = 0;
      uVar2 = 0;
      local_110 = loc1;
      do {
        if (uVar2 != 0) {
          if (((0xe < uVar2) || (NAN(local_150))) || (ABS(local_f8) <= dTol)) {
            bVar1 = PtIsOnLocus(loc1,&local_128,1e-06);
            if (!bVar1) {
              return 0;
            }
            bVar1 = PtIsOnLocus(local_108,&local_c8,1e-06);
            if (!bVar1) {
              return 0;
            }
            local_a0->latitude = local_128.latitude;
            local_a0->longitude = local_128.longitude;
            return 1;
          }
          LVar3 = DestVincenty(&loc1->geoStart,local_148,local_150);
          local_140.longitude = LVar3.longitude;
          local_140.latitude = LVar3.latitude;
        }
        LVar3 = PointOnLocusP(loc1,&local_140,dTol,local_100);
        loc = local_108;
        local_128.longitude = LVar3.longitude;
        local_128.latitude = LVar3.latitude;
        LVar3 = PerpIntercept(&local_108->geoStart,local_98,&local_128,&local_90,&local_130,dTol);
        local_88.longitude = LVar3.longitude;
        local_88.latitude = LVar3.latitude;
        LVar3 = PointOnLocusP(loc,&local_88,dTol,local_100);
        local_c8.longitude = LVar3.longitude;
        local_c8.latitude = LVar3.latitude;
        DistVincenty(&local_128,&local_c8,&local_b8);
        loc1 = local_110;
        local_e8 = dStack_e0;
        local_f8 = local_b8.distance;
        uStack_f0 = 0;
        dStack_e0 = local_b8.distance;
        local_d8 = dStack_d0;
        dStack_d0 = local_150;
        if (uVar2 == 0) {
          LVar3 = PerpIntercept(&local_110->geoStart,local_148,&local_c8,&local_90,&local_130,dTol);
          local_140.longitude = LVar3.longitude;
          local_140.latitude = LVar3.latitude;
          DistVincenty(&loc1->geoStart,&local_140,&local_b8);
          local_150 = local_b8.distance;
        }
        else {
          FindLinearRoot(&local_d8,&local_e8,&local_150);
          loc1 = local_110;
        }
        uVar2 = uVar2 + 1;
      } while( true );
    }
  }
  return 0;
}

Assistant:

int LocusIntersect(const Locus &loc1, const Locus &loc2, LLPoint &intersect,
                       double dTol, double dEps)
    {
        InverseResult result;
        DistVincenty(loc1.locusStart, loc1.locusEnd, result);
        const double crs1 = result.azimuth;

        DistVincenty(loc2.locusStart, loc2.locusEnd, result);
        const double crs2 = result.azimuth;

        LLPoint p1;
        if (!CrsIntersect(loc1.locusStart, crs1, loc2.locusStart, crs2, dTol, p1))
            return 0;

        DistVincenty(loc1.geoStart, loc1.geoEnd, result);
        const double tcrs1 = result.azimuth;

        DistVincenty(loc2.geoStart, loc2.geoEnd, result);
        const double tcrs2 = result.azimuth;

        double dCrsFromPt, dDistFromP;
        LLPoint pint1 = PerpIntercept(loc1.geoStart, tcrs1, p1, dCrsFromPt, dDistFromP, dTol);

        PtIsOnGeodesicResult ptResult;
        if (!PtIsOnGeodesic(loc1.geoStart, loc1.geoEnd, pint1, 0, ptResult)
            || !ptResult.result)
            return 0;

        DistVincenty(loc1.geoStart, pint1, result);
        double distbase = result.distance;

        LLPoint ploc1, ploc2;
        double distarray[2], errarray[2];
        distarray[0] = distarray[1] = errarray[0] = errarray[1] = 0.0;


        const int maxCount = 15;
        double dErr = 0.0;
        int k = 0;
        while ((k == 0) || (!std::isnan(distbase) && k < maxCount && fabs(dErr) > dTol))
        {
            if (k > 0)
                pint1 = DestVincenty(loc1.geoStart, tcrs1, distbase);
            ploc1 = PointOnLocusP(loc1, pint1, dTol, dEps);
            const LLPoint pint2 = PerpIntercept(loc2.geoStart, tcrs2, ploc1, dCrsFromPt, dDistFromP, dTol);

            ploc2 = PointOnLocusP(loc2, pint2, dTol, dEps);
            DistVincenty(ploc1, ploc2, result);
            dErr = result.distance;

            errarray[0] = errarray[1];
            errarray[1] = dErr;
            distarray[0] = distarray[1];
            distarray[1] = distbase;
            if (k == 0)
            {
                pint1 = PerpIntercept(loc1.geoStart, tcrs1, ploc2, dCrsFromPt, dDistFromP, dTol);
                DistVincenty(loc1.geoStart, pint1, result);
                distbase = result.distance;
            }
            else
            {
                FindLinearRoot(distarray, errarray, distbase);
            }
            k++;
        }

        if (!PtIsOnLocus(loc1, ploc1, 1e-6) || !PtIsOnLocus(loc2, ploc2, 1e-6))
            return 0;

        intersect = ploc1;
        return 1;
    }